

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.h
# Opt level: O0

SquareMatrix<3> * pbrt::WhiteBalance(Point2f srcWhite,Point2f targetWhite)

{
  Point2f xy;
  Point2f xy_00;
  Float *pFVar1;
  SquareMatrix<3> *in_RDI;
  undefined1 in_ZMM0 [64];
  undefined1 auVar6 [56];
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 in_ZMM1 [64];
  XYZ XVar7;
  SquareMatrix<3> LMScorrect;
  XYZ dstLMS;
  XYZ srcLMS;
  XYZ dstXYZ;
  XYZ srcXYZ;
  Float in_stack_fffffffffffffee0;
  float fVar8;
  float in_stack_fffffffffffffee8;
  float in_stack_fffffffffffffef0;
  Float v;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  SquareMatrix<3> *in_stack_ffffffffffffff58;
  SquareMatrix<3> *m1;
  SquareMatrix<3> *local_8c;
  Float local_84;
  XYZ local_80;
  XYZ local_70;
  undefined8 local_60;
  Float local_58;
  undefined8 local_50;
  undefined8 local_48;
  Float local_40;
  undefined8 local_38;
  Float local_30;
  undefined8 local_28;
  undefined8 local_20;
  Float local_18;
  undefined8 local_10;
  undefined8 local_8;
  
  local_28 = vmovlpd_avx(in_ZMM0._0_16_);
  local_10 = vmovlpd_avx(in_ZMM1._0_16_);
  auVar6 = ZEXT856(0);
  fVar8 = 1.0;
  xy.super_Tuple2<pbrt::Point2,_float>.y = in_stack_fffffffffffffee8;
  xy.super_Tuple2<pbrt::Point2,_float>.x = 1.0;
  local_8 = local_28;
  XVar7 = XYZ::FromxyY(xy,in_stack_fffffffffffffee0);
  local_30 = XVar7.Z;
  auVar2._0_8_ = XVar7._0_8_;
  auVar2._8_56_ = auVar6;
  local_38 = vmovlpd_avx(auVar2._0_16_);
  local_50 = local_10;
  auVar6 = ZEXT856(0);
  xy_00.super_Tuple2<pbrt::Point2,_float>.y = in_stack_fffffffffffffee8;
  xy_00.super_Tuple2<pbrt::Point2,_float>.x = fVar8;
  local_20 = local_38;
  local_18 = local_30;
  XVar7 = XYZ::FromxyY(xy_00,in_stack_fffffffffffffee0);
  local_58 = XVar7.Z;
  auVar3._0_8_ = XVar7._0_8_;
  auVar3._8_56_ = auVar6;
  local_60 = vmovlpd_avx(auVar3._0_16_);
  fVar8 = 0.0;
  local_48 = local_60;
  local_40 = local_58;
  XVar7 = operator*((SquareMatrix<3> *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00)
                    ,(XYZ *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  local_80.Z = XVar7.Z;
  auVar4._0_8_ = XVar7._0_8_;
  auVar4._8_56_ = auVar6;
  local_80._0_8_ = vmovlpd_avx(auVar4._0_16_);
  local_70._0_8_ = local_80._0_8_;
  local_70.Z = local_80.Z;
  XVar7 = operator*((SquareMatrix<3> *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00)
                    ,(XYZ *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  local_84 = XVar7.Z;
  auVar5._0_8_ = XVar7._0_8_;
  auVar5._8_56_ = auVar6;
  m1 = (SquareMatrix<3> *)vmovlpd_avx(auVar5._0_16_);
  local_8c = m1;
  pFVar1 = XYZ::operator[]((XYZ *)&local_8c,0);
  v = *pFVar1;
  XYZ::operator[](&local_70,0);
  XYZ::operator[]((XYZ *)&local_8c,1);
  XYZ::operator[](&local_70,1);
  XYZ::operator[]((XYZ *)&local_8c,2);
  XYZ::operator[](&local_70,2);
  SquareMatrix<3>::Diag<float,float>(v,in_stack_fffffffffffffef0,fVar8);
  operator*(m1,in_stack_ffffffffffffff58);
  operator*(m1,in_stack_ffffffffffffff58);
  return in_RDI;
}

Assistant:

inline SquareMatrix<3> WhiteBalance(Point2f srcWhite, Point2f targetWhite) {
    XYZ srcXYZ = XYZ::FromxyY(srcWhite), dstXYZ = XYZ::FromxyY(targetWhite);

    auto srcLMS = LMSFromXYZ * srcXYZ, dstLMS = LMSFromXYZ * dstXYZ;
    SquareMatrix<3> LMScorrect = SquareMatrix<3>::Diag(
        dstLMS[0] / srcLMS[0], dstLMS[1] / srcLMS[1], dstLMS[2] / srcLMS[2]);

    return XYZFromLMS * LMScorrect * LMSFromXYZ;
}